

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void glist_redrawall(_glist *gl,int action)

{
  int iVar1;
  int iVar2;
  _glist *p_Stack_20;
  int vis;
  t_gobj *g;
  int action_local;
  _glist *gl_local;
  
  iVar1 = glist_isvisible(gl);
  for (p_Stack_20 = (_glist *)gl->gl_list; p_Stack_20 != (_glist *)0x0;
      p_Stack_20 = (_glist *)(p_Stack_20->gl_obj).te_g.g_next) {
    if ((iVar1 == 0) || ((p_Stack_20->gl_obj).te_g.g_pd != scalar_class)) {
      if ((p_Stack_20->gl_obj).te_g.g_pd == canvas_class) {
        glist_redrawall(p_Stack_20,action);
      }
    }
    else if (action == 1) {
      iVar2 = glist_isvisible(gl);
      if (iVar2 != 0) {
        gobj_vis((t_gobj *)p_Stack_20,gl,1);
      }
    }
    else if (action == 2) {
      iVar2 = glist_isvisible(gl);
      if (iVar2 != 0) {
        gobj_vis((t_gobj *)p_Stack_20,gl,0);
      }
    }
    else {
      scalar_redraw((t_scalar *)p_Stack_20,gl);
    }
  }
  return;
}

Assistant:

static void glist_redrawall(t_glist *gl, int action)
{
    t_gobj *g;
    int vis = glist_isvisible(gl);
    for (g = gl->gl_list; g; g = g->g_next)
    {
        if (vis && g->g_pd == scalar_class)
        {
            if (action == 1)
            {
                if (glist_isvisible(gl))
                    gobj_vis(g, gl, 1);
            }
            else if (action == 2)
            {
                if (glist_isvisible(gl))
                    gobj_vis(g, gl, 0);
            }
            else scalar_redraw((t_scalar *)g, gl);
        }
        else if (g->g_pd == canvas_class)
            glist_redrawall((t_glist *)g, action);
    }
}